

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_application_filter.cpp
# Opt level: O2

VkPhysicalDeviceVulkan12Features *
Fossilize::find_pnext<VkPhysicalDeviceVulkan12Features>(VkStructureType type,void *pNext)

{
  VkPhysicalDeviceVulkan12Features *pVVar1;
  undefined4 in_register_0000003c;
  
  for (pVVar1 = (VkPhysicalDeviceVulkan12Features *)CONCAT44(in_register_0000003c,type);
      (pVVar1 != (VkPhysicalDeviceVulkan12Features *)0x0 &&
      (pVVar1->sType != VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_VULKAN_1_2_FEATURES));
      pVVar1 = (VkPhysicalDeviceVulkan12Features *)pVVar1->pNext) {
  }
  return pVVar1;
}

Assistant:

static inline const T *find_pnext(VkStructureType type, const void *pNext)
{
	while (pNext != nullptr)
	{
		auto *sin = static_cast<const VkBaseInStructure *>(pNext);
		if (sin->sType == type)
			return static_cast<const T*>(pNext);

		pNext = sin->pNext;
	}

	return nullptr;
}